

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sampleCopy(Stat4Accum *p,Stat4Sample *pTo,Stat4Sample *pFrom)

{
  anon_union_8_2_79e07f19_for_u aVar1;
  
  pTo->isPSample = pFrom->isPSample;
  pTo->iCol = pFrom->iCol;
  pTo->iHash = pFrom->iHash;
  memcpy(pTo->anEq,pFrom->anEq,(long)p->nCol << 2);
  memcpy(pTo->anLt,pFrom->anLt,(long)p->nCol << 2);
  memcpy(pTo->anDLt,pFrom->anDLt,(long)p->nCol << 2);
  if (pFrom->nRowid != 0) {
    sampleSetRowid(p->db,pTo,pFrom->nRowid,(pFrom->u).aRowid);
    return;
  }
  aVar1 = pFrom->u;
  if ((pTo->nRowid != 0) && ((pTo->u).aRowid != (u8 *)0x0)) {
    sqlite3DbFreeNN(p->db,(pTo->u).aRowid);
  }
  pTo->nRowid = 0;
  pTo->u = aVar1;
  return;
}

Assistant:

static void sampleCopy(Stat4Accum *p, Stat4Sample *pTo, Stat4Sample *pFrom){
  pTo->isPSample = pFrom->isPSample;
  pTo->iCol = pFrom->iCol;
  pTo->iHash = pFrom->iHash;
  memcpy(pTo->anEq, pFrom->anEq, sizeof(tRowcnt)*p->nCol);
  memcpy(pTo->anLt, pFrom->anLt, sizeof(tRowcnt)*p->nCol);
  memcpy(pTo->anDLt, pFrom->anDLt, sizeof(tRowcnt)*p->nCol);
  if( pFrom->nRowid ){
    sampleSetRowid(p->db, pTo, pFrom->nRowid, pFrom->u.aRowid);
  }else{
    sampleSetRowidInt64(p->db, pTo, pFrom->u.iRowid);
  }
}